

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O2

void SRCTools::SincResampler::KaizerWindow::windowedSinc
               (FIRCoefficient *kernel,uint order,double fc,double beta,double amp)

{
  ulong uVar1;
  int i;
  uint uVar2;
  FIRCoefficient *pFVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double __x;
  
  uVar1 = (ulong)order;
  dVar5 = bessel(beta);
  pFVar3 = kernel;
  for (uVar2 = order; -1 < (int)uVar2; uVar2 = uVar2 - 2) {
    dVar6 = (1.0 / (double)uVar1) * (double)(int)uVar2;
    dVar6 = bessel(SQRT(ABS(1.0 - dVar6 * dVar6)) * beta);
    dVar7 = 1.0;
    if (uVar2 != 0) {
      __x = (double)(int)uVar2 * fc * 3.141592653589793;
      dVar7 = sin(__x);
      dVar7 = dVar7 / __x;
    }
    fVar4 = (float)(dVar6 * dVar7 * (((fc + fc) * amp) / dVar5));
    *pFVar3 = fVar4;
    kernel[order] = fVar4;
    pFVar3 = pFVar3 + 1;
    order = order - 1;
  }
  return;
}

Assistant:

void KaizerWindow::windowedSinc(FIRCoefficient kernel[], const unsigned int order, const double fc, const double beta, const double amp) {
	const double fc_pi = M_PI * fc;
	const double recipOrder = 1.0 / order;
	const double mult = 2.0 * fc * amp / bessel(beta);
	for (int i = order, j = 0; 0 <= i; i -= 2, ++j) {
		double xw = i * recipOrder;
		double win = bessel(beta * sqrt(fabs(1.0 - xw * xw)));
		double xs = i * fc_pi;
		double sinc = (i == 0) ? 1.0 : sin(xs) / xs;
		FIRCoefficient imp = FIRCoefficient(mult * sinc * win);
		kernel[j] = imp;
		kernel[order - j] = imp;
	}
}